

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::FindPrevUserEntry(DBIter *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  Slice *k;
  size_t sVar4;
  long in_RDI;
  Slice SVar5;
  string empty;
  Slice raw_value;
  ParsedInternalKey ikey;
  ValueType value_type;
  string *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  DBIter *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  string local_70 [16];
  ParsedInternalKey *in_stack_ffffffffffffffa0;
  DBIter *in_stack_ffffffffffffffa8;
  Slice local_50;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  ulong local_20;
  int local_18;
  int local_c;
  
  local_c = 0;
  uVar3 = (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))();
  while ((uVar3 & 1) != 0) {
    ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)0x11fa19);
    bVar1 = ParseKey(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if ((bVar1) && (local_20 <= *(ulong *)(in_RDI + 0x40))) {
      in_stack_ffffffffffffff67 = false;
      if (local_c != 0) {
        in_stack_ffffffffffffff50 = *(DBIter **)(in_RDI + 0x30);
        Slice::Slice((Slice *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        iVar2 = (*(in_stack_ffffffffffffff50->super_Iterator)._vptr_Iterator[2])
                          (in_stack_ffffffffffffff50,local_30,local_40);
        in_stack_ffffffffffffff67 = iVar2 < 0;
      }
      if ((bool)in_stack_ffffffffffffff67 != false) break;
      local_c = local_18;
      if (local_18 == 0) {
        std::__cxx11::string::clear();
        ClearSavedValue((DBIter *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      }
      else {
        SVar5 = (Slice)(**(code **)(**(long **)(in_RDI + 0x38) + 0x48))();
        local_50 = SVar5;
        k = (Slice *)std::__cxx11::string::capacity();
        sVar4 = Slice::size(&local_50);
        if ((Slice *)(sVar4 + 0x100000) < k) {
          std::__cxx11::string::string(local_70);
          std::swap<char,std::char_traits<char>,std::allocator<char>>
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          std::__cxx11::string::~string(local_70);
        }
        (**(code **)(**(long **)(in_RDI + 0x38) + 0x40))();
        ExtractUserKey((Slice *)in_stack_ffffffffffffff40);
        SaveKey(in_stack_ffffffffffffff50,k,in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff38 = (string *)(in_RDI + 0x70);
        in_stack_ffffffffffffff40 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Slice::data(&local_50);
        Slice::size(&local_50);
        std::__cxx11::string::assign
                  ((char *)in_stack_ffffffffffffff38,(ulong)in_stack_ffffffffffffff40);
      }
    }
    (**(code **)(**(long **)(in_RDI + 0x38) + 0x38))();
    uVar3 = (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))();
  }
  if (local_c == 0) {
    *(undefined1 *)(in_RDI + 0x94) = 0;
    std::__cxx11::string::clear();
    ClearSavedValue((DBIter *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    *(undefined4 *)(in_RDI + 0x90) = 0;
  }
  else {
    *(undefined1 *)(in_RDI + 0x94) = 1;
  }
  return;
}

Assistant:

void DBIter::FindPrevUserEntry() {
  assert(direction_ == kReverse);

  ValueType value_type = kTypeDeletion;
  if (iter_->Valid()) {
    do {
      ParsedInternalKey ikey;
      if (ParseKey(&ikey) && ikey.sequence <= sequence_) {
        if ((value_type != kTypeDeletion) &&
            user_comparator_->Compare(ikey.user_key, saved_key_) < 0) {
          // We encountered a non-deleted value in entries for previous keys,
          break;
        }
        value_type = ikey.type;
        if (value_type == kTypeDeletion) {
          saved_key_.clear();
          ClearSavedValue();
        } else {
          Slice raw_value = iter_->value();
          if (saved_value_.capacity() > raw_value.size() + 1048576) {
            std::string empty;
            swap(empty, saved_value_);
          }
          SaveKey(ExtractUserKey(iter_->key()), &saved_key_);
          saved_value_.assign(raw_value.data(), raw_value.size());
        }
      }
      iter_->Prev();
    } while (iter_->Valid());
  }

  if (value_type == kTypeDeletion) {
    // End
    valid_ = false;
    saved_key_.clear();
    ClearSavedValue();
    direction_ = kForward;
  } else {
    valid_ = true;
  }
}